

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O0

Complex __thiscall libDAI::MF::logZ(MF *this)

{
  ulong uVar1;
  bool bVar2;
  long *plVar3;
  TFactor<double> *pTVar4;
  ulong uVar5;
  reference puVar6;
  long *in_RDI;
  TFactor<double> *extraout_XMM0_Qa;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar7;
  complex<double> cVar8;
  Factor piet;
  nb_cit j;
  Factor henk;
  size_t I;
  size_t i;
  Complex sum;
  undefined4 in_stack_fffffffffffffe28;
  NormType in_stack_fffffffffffffe2c;
  FactorGraph *in_stack_fffffffffffffe30;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe38;
  TFactor<double> *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe50;
  MF *in_stack_fffffffffffffe58;
  TFactor<double> *in_stack_fffffffffffffe88;
  TFactor<double> *this_00;
  complex<double> local_160 [8];
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0 [8];
  ulong local_90;
  TFactor<double> *local_40;
  undefined8 local_38;
  TFactor<double> *local_30;
  complex<double> local_28 [2];
  
  std::complex<double>::complex(local_28,0.0,0.0);
  local_30 = (TFactor<double> *)0x0;
  while( true ) {
    this_00 = local_30;
    plVar3 = (long *)(**(code **)(*in_RDI + 0x20))();
    pTVar4 = (TFactor<double> *)(**(code **)(*plVar3 + 0x28))();
    if (pTVar4 <= this_00) break;
    in_stack_fffffffffffffe88 = extraout_XMM0_Qa;
    uVar7 = extraout_XMM1_Qa;
    beliefV(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    TFactor<double>::entropy((TFactor<double> *)0xb919c8);
    local_40 = in_stack_fffffffffffffe88;
    local_38 = uVar7;
    std::complex<double>::operator-=
              ((complex<double> *)in_stack_fffffffffffffe30,
               (complex<double> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe30);
    local_30 = (TFactor<double> *)
               ((long)&(local_30->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  local_90 = 0;
  while( true ) {
    uVar1 = local_90;
    plVar3 = (long *)(**(code **)(*in_RDI + 0x20))();
    uVar5 = (**(code **)(*plVar3 + 0x48))();
    if (uVar5 <= uVar1) break;
    TFactor<double>::TFactor(in_stack_fffffffffffffe40);
    pTVar4 = (TFactor<double> *)(**(code **)(*in_RDI + 0x20))();
    FactorGraph::nbF(in_stack_fffffffffffffe30,
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_d0[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    while( true ) {
      (**(code **)(*in_RDI + 0x20))();
      FactorGraph::nbF(in_stack_fffffffffffffe30,
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      local_d8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe30,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (!bVar2) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_d0);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x29),*puVar6);
      TFactor<double>::operator*=(this_00,in_stack_fffffffffffffe88);
      local_e0 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator++(in_stack_fffffffffffffe38,
                              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    }
    TFactor<double>::normalize
              ((TFactor<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    TFactor<double>::TFactor(in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe40 = (TFactor<double> *)(**(code **)(*in_RDI + 0x20))();
    in_stack_fffffffffffffe38 =
         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)(*(code *)(in_stack_fffffffffffffe40->_vs)._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start[5]._label)
                      (in_stack_fffffffffffffe40,local_90);
    TFactor<double>::log0(pTVar4);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffe30,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe30);
    TFactor<double>::operator*=(this_00,in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe30 =
         (FactorGraph *)TFactor<double>::totalSum((TFactor<double> *)0xb91c5e);
    std::complex<double>::complex(local_160,(double)in_stack_fffffffffffffe30,0.0);
    std::complex<double>::operator-=
              ((complex<double> *)in_stack_fffffffffffffe30,
               (complex<double> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe30);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe30);
    local_90 = local_90 + 1;
  }
  cVar8 = std::operator-((complex<double> *)in_stack_fffffffffffffe40);
  return (Complex)cVar8._M_value;
}

Assistant:

Complex MF::logZ() const {
        Complex sum = 0.0;
        
        for(size_t i=0; i < grm().nrVars(); i++ )
            sum -= beliefV(i).entropy();
        for(size_t I=0; I < grm().nrFactors(); I++ ) {
            Factor henk;
            for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ )   // for all j in I
                henk *= _beliefs[*j];
            henk.normalize();
            Factor piet;
            piet = grm().factor(I).log0();
            piet *= henk;
            sum -= Complex( piet.totalSum() );
        }

        return -sum;
    }